

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O0

void __thiscall FastRandomContext::Reseed(FastRandomContext *this,uint256 *seed)

{
  long in_RDI;
  long in_FS_OFFSET;
  Span<const_std::byte> key;
  ChaCha20 *in_stack_ffffffffffffff48;
  uint256 *in_stack_ffffffffffffff58;
  ChaCha20 *this_00;
  ChaCha20 local_7c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  RandomMixin<FastRandomContext>::FlushCache
            ((RandomMixin<FastRandomContext> *)in_stack_ffffffffffffff48);
  *(undefined1 *)(in_RDI + 0xc) = 0;
  key = MakeByteSpan<uint256_const&>(in_stack_ffffffffffffff58);
  this_00 = &local_7c;
  ChaCha20::ChaCha20(in_stack_ffffffffffffff48,key);
  *(uint *)(in_RDI + 0x80) = local_7c.m_bufleft;
  *(undefined8 *)(in_RDI + 0x70) = local_7c.m_buffer._M_elems._48_8_;
  *(undefined8 *)(in_RDI + 0x78) = local_7c.m_buffer._M_elems._56_8_;
  *(undefined8 *)(in_RDI + 0x60) = local_7c.m_buffer._M_elems._32_8_;
  *(undefined8 *)(in_RDI + 0x68) = local_7c.m_buffer._M_elems._40_8_;
  *(undefined8 *)(in_RDI + 0x50) = local_7c.m_buffer._M_elems._16_8_;
  *(undefined8 *)(in_RDI + 0x58) = local_7c.m_buffer._M_elems._24_8_;
  *(undefined8 *)(in_RDI + 0x40) = local_7c.m_buffer._M_elems._0_8_;
  *(undefined8 *)(in_RDI + 0x48) = local_7c.m_buffer._M_elems._8_8_;
  *(undefined8 *)(in_RDI + 0x30) = local_7c.m_aligned.input._32_8_;
  *(undefined8 *)(in_RDI + 0x38) = local_7c.m_aligned.input._40_8_;
  *(undefined8 *)(in_RDI + 0x20) = local_7c.m_aligned.input._16_8_;
  *(undefined8 *)(in_RDI + 0x28) = local_7c.m_aligned.input._24_8_;
  *(undefined8 *)(in_RDI + 0x10) = local_7c.m_aligned.input._0_8_;
  *(undefined8 *)(in_RDI + 0x18) = local_7c.m_aligned.input._8_8_;
  ChaCha20::~ChaCha20(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void FastRandomContext::Reseed(const uint256& seed) noexcept
{
    FlushCache();
    requires_seed = false;
    rng = {MakeByteSpan(seed)};
}